

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::ShaderExecUtil::TessEvaluationExecutor::TessEvaluationExecutor
          (TessEvaluationExecutor *this,RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  GLSLVersion version;
  bool bVar1;
  ProgramSources *pPVar2;
  char *pcVar3;
  ostream *poVar4;
  GLSLVersion version_00;
  GLSLVersion version_01;
  ShaderSpec *shaderSpec_00;
  int ndx;
  int iVar5;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  undefined1 local_2f0 [40];
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  undefined1 local_278 [376];
  ProgramSources local_100;
  
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  generateVertexShaderForTess_abi_cxx11_
            (&local_310,(ShaderExecUtil *)(ulong)shaderSpec->version,version_00);
  glu::VertexSource::VertexSource((VertexSource *)local_2a0,&local_310);
  pPVar2 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_2a0);
  version = shaderSpec->version;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  pcVar3 = glu::getGLSLVersionDeclaration(version);
  poVar4 = std::operator<<((ostream *)local_278,pcVar3);
  std::operator<<(poVar4,"\n");
  bVar1 = glu::glslVersionIsES(version);
  if (bVar1 && (int)version < 3) {
    std::operator<<((ostream *)local_278,"#extension GL_EXT_tessellation_shader : require\n\n");
  }
  std::operator<<((ostream *)local_278,"layout(vertices = 1) out;\n\n");
  std::operator<<((ostream *)local_278,"void main (void)\n{\n");
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    poVar4 = std::operator<<((ostream *)local_278,"\tgl_TessLevelInner[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    std::operator<<(poVar4,"] = 1.0;\n");
  }
  for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
    poVar4 = std::operator<<((ostream *)local_278,"\tgl_TessLevelOuter[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    std::operator<<(poVar4,"] = 1.0;\n");
  }
  std::operator<<((ostream *)local_278,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_2c8,&local_330);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_2c8);
  generateTessEvalShader_abi_cxx11_(&local_350,(TessEvaluationExecutor *)shaderSpec,shaderSpec_00);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_278,&local_350);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_278);
  generateEmptyFragmentSource_abi_cxx11_
            (&local_370,(ShaderExecUtil *)(ulong)shaderSpec->version,version_01);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2f0,&local_370);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_2f0);
  BufferIoExecutor::BufferIoExecutor(&this->super_BufferIoExecutor,renderCtx,shaderSpec,pPVar2);
  std::__cxx11::string::~string((string *)(local_2f0 + 8));
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)(local_278 + 8));
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)(local_2c8 + 8));
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)(local_2a0 + 8));
  std::__cxx11::string::~string((string *)&local_310);
  glu::ProgramSources::~ProgramSources(&local_100);
  (this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor =
       (_func_int **)&PTR__TessControlExecutor_00a303a8;
  return;
}

Assistant:

TessEvaluationExecutor::TessEvaluationExecutor (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
	: BufferIoExecutor	(renderCtx, shaderSpec, glu::ProgramSources()
							<< glu::VertexSource(generateVertexShaderForTess(shaderSpec.version))
							<< glu::TessellationControlSource(generatePassthroughTessControlShader(shaderSpec.version))
							<< glu::TessellationEvaluationSource(generateTessEvalShader(shaderSpec))
							<< glu::FragmentSource(generateEmptyFragmentSource(shaderSpec.version)))
{
}